

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O3

void __thiscall QToolBarLayout::insertAction(QToolBarLayout *this,int index,QAction *action)

{
  ulong uVar1;
  QToolBarItem *pQVar2;
  ulong i;
  P _a;
  long in_FS_OFFSET;
  QToolBarItem *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (this->items).d.size;
  pQVar2 = createItem(this,action);
  if (pQVar2 != (QToolBarItem *)0x0) {
    i = 0;
    if (0 < index) {
      i = (ulong)(uint)index;
    }
    if (uVar1 < i) {
      i = uVar1;
    }
    local_28 = pQVar2;
    QtPrivate::QPodArrayOps<QToolBarItem*>::emplace<QToolBarItem*&>
              ((QPodArrayOps<QToolBarItem*> *)&this->items,i,&local_28);
    QList<QToolBarItem_*>::begin(&this->items);
    (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBarLayout::insertAction(int index, QAction *action)
{
    index = qMax(0, index);
    index = qMin(items.size(), index);

    QToolBarItem *item = createItem(action);
    if (item) {
        items.insert(index, item);
        invalidate();
    }
}